

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O2

void test_obj(float id,Am_Object *result,Am_Object *expected)

{
  char cVar1;
  ostream *poVar2;
  
  test_counter = test_counter + 1;
  if (suppress_successful == 0) {
    printf("%f     ",(double)id);
  }
  else if (test_counter % 0x32 == 0) {
    printf("Test %d\n");
  }
  cVar1 = Am_Object::operator==(result,expected);
  if (cVar1 == '\0') {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,id);
    poVar2 = std::operator<<(poVar2,"       expected ");
    poVar2 = (ostream *)operator<<(poVar2,expected);
    poVar2 = std::operator<<(poVar2,", result is ");
    poVar2 = (ostream *)operator<<(poVar2,result);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"*** TEST DID NOT SUCCEED. ***");
    std::endl<char,std::char_traits<char>>(poVar2);
    failed_tests = failed_tests + 1;
  }
  else if (suppress_successful == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"  result is ");
    poVar2 = (ostream *)operator<<(poVar2,result);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

void
test_obj(float id, Am_Object result, Am_Object expected)
{
  ++test_counter;
  if (suppress_successful) {
    if ((test_counter % 50) == 0)
      printf("Test %d\n", test_counter);
  } else
    printf("%f     ", id);

  if (result == expected) {
    if (!suppress_successful)
      cout << "  result is " << result << endl;
  } else {
    cout << id << "       expected " << expected << ", result is " << result
         << endl
         << "*** TEST DID NOT SUCCEED. ***" << endl;
    ++failed_tests;
  }
}